

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatFile.h
# Opt level: O3

void __thiscall
FlatFile<int,_int>::FlatFile(FlatFile<int,_int> *this,ion_dictionary_config_info_t config)

{
  ion_err_t iVar1;
  ion_dictionary_config_info_t local_38;
  
  ffdict_init((ion_dictionary_handler_t *)this);
  local_38.value_size = config.value_size;
  local_38.dictionary_size = config.dictionary_size;
  local_38.dictionary_type = config.dictionary_type;
  local_38.dictionary_status = config.dictionary_status;
  local_38._29_3_ = config._29_3_;
  local_38.id = config.id;
  local_38.use_type = config.use_type;
  local_38._5_3_ = config._5_3_;
  local_38.type = config.type;
  local_38.key_size = config.key_size;
  iVar1 = dictionary_open((ion_dictionary_handler_t *)this,&(this->super_Dictionary<int,_int>).dict,
                          &local_38);
  (this->super_Dictionary<int,_int>).key_type = local_38.type;
  (this->super_Dictionary<int,_int>).key_size = local_38.key_size;
  (this->super_Dictionary<int,_int>).value_size = local_38.value_size;
  (this->super_Dictionary<int,_int>).dict_size = local_38.dictionary_size;
  (this->super_Dictionary<int,_int>).last_status.error = iVar1;
  return;
}

Assistant:

FlatFile(
	ion_dictionary_config_info_t config
) {
	ffdict_init(&this->handler);

	this->open(config);
}